

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void opj_mqc_renorme(opj_mqc_t *mqc)

{
  opj_mqc_t *mqc_local;
  
  do {
    mqc->a = mqc->a << 1;
    mqc->c = mqc->c << 1;
    mqc->ct = mqc->ct - 1;
    if (mqc->ct == 0) {
      opj_mqc_byteout(mqc);
    }
  } while ((mqc->a & 0x8000) == 0);
  return;
}

Assistant:

static void opj_mqc_renorme(opj_mqc_t *mqc)
{
    do {
        mqc->a <<= 1;
        mqc->c <<= 1;
        mqc->ct--;
        if (mqc->ct == 0) {
            opj_mqc_byteout(mqc);
        }
    } while ((mqc->a & 0x8000) == 0);
}